

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_misc.cpp
# Opt level: O0

spv_result_t spvtools::val::anon_unknown_4::ValidateUndef(ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  uint32_t uVar3;
  DiagnosticStream *pDVar4;
  DiagnosticStream local_3d0;
  DiagnosticStream local_1f8;
  Instruction *local_20;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  local_20 = inst;
  inst_local = (Instruction *)_;
  uVar3 = val::Instruction::type_id(inst);
  bVar2 = ValidationState_t::IsVoidType(_,uVar3);
  if (bVar2) {
    ValidationState_t::diag
              (&local_1f8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,local_20);
    pDVar4 = DiagnosticStream::operator<<
                       (&local_1f8,(char (*) [46])"Cannot create undefined values with void type");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
    DiagnosticStream::~DiagnosticStream(&local_1f8);
  }
  else {
    bVar2 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,CapabilityShader);
    pIVar1 = inst_local;
    if (bVar2) {
      uVar3 = val::Instruction::type_id(local_20);
      bVar2 = ValidationState_t::ContainsLimitedUseIntOrFloatType((ValidationState_t *)pIVar1,uVar3)
      ;
      pIVar1 = inst_local;
      if (bVar2) {
        uVar3 = val::Instruction::type_id(local_20);
        bVar2 = ValidationState_t::IsPointerType((ValidationState_t *)pIVar1,uVar3);
        if (!bVar2) {
          ValidationState_t::diag
                    (&local_3d0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,local_20);
          pDVar4 = DiagnosticStream::operator<<
                             (&local_3d0,
                              (char (*) [55])
                              "Cannot create undefined values with 8- or 16-bit types");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
          DiagnosticStream::~DiagnosticStream(&local_3d0);
          return __local._4_4_;
        }
      }
    }
    __local._4_4_ = SPV_SUCCESS;
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateUndef(ValidationState_t& _, const Instruction* inst) {
  if (_.IsVoidType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Cannot create undefined values with void type";
  }
  if (_.HasCapability(spv::Capability::Shader) &&
      _.ContainsLimitedUseIntOrFloatType(inst->type_id()) &&
      !_.IsPointerType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Cannot create undefined values with 8- or 16-bit types";
  }

  return SPV_SUCCESS;
}